

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O1

void mp::WriteModelItem(MemoryWriter *wrt,QuadAndLinTerms *qlt,ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  
  WriteModelItem(wrt,&qlt->super_LinTerms,vnam);
  if ((qlt->super_QuadTerms).folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      != 0) {
    if ((qlt->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
      uVar4 = pBVar1->size_ + 3;
      if (pBVar1->capacity_ < uVar4) {
        (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
      }
      pcVar2 = pBVar1->ptr_;
      sVar3 = pBVar1->size_;
      pcVar2[sVar3 + 2] = ' ';
      pcVar2 = pcVar2 + sVar3;
      pcVar2[0] = ' ';
      pcVar2[1] = '+';
      pBVar1->size_ = uVar4;
    }
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    if (pBVar1->size_ == pBVar1->capacity_) {
      (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
    }
    sVar3 = pBVar1->size_;
    pBVar1->size_ = sVar3 + 1;
    pBVar1->ptr_[sVar3] = '(';
    WriteModelItem(wrt,&qlt->super_QuadTerms,vnam);
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    if (pBVar1->size_ == pBVar1->capacity_) {
      (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
    }
    sVar3 = pBVar1->size_;
    pBVar1->size_ = sVar3 + 1;
    pBVar1->ptr_[sVar3] = ')';
  }
  return;
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const QuadAndLinTerms& qlt,
                    ItemNamer& vnam) {
  WriteModelItem(wrt, qlt.GetLinTerms(), vnam);
  if (qlt.GetQPTerms().size()) {
    if (qlt.GetLinTerms().size())
      wrt << " + ";
    wrt << '(';
    WriteModelItem(wrt, qlt.GetQPTerms(), vnam);
    wrt << ')';
  }
}